

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageLoadStoreTests.cpp
# Opt level: O0

bool __thiscall
glcts::(anonymous_namespace)::BasicAllFormatsStoreFS::Write<tcu::Vector<float,4>>
          (BasicAllFormatsStoreFS *this,GLenum internalformat,Vector<float,_4> *write_value,
          Vector<float,_4> *expected_value)

{
  uint uVar1;
  bool bVar2;
  GLuint GVar3;
  char *src_fs;
  reference data_00;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  string local_168;
  Vector<float,_4> local_148;
  string local_138;
  Vector<float,_4> local_118;
  string local_108;
  uint local_e4;
  void *pvStack_e0;
  int i;
  Vector<float,_4> *map_data;
  GLuint m_buffer;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> out_data;
  GLuint c_program;
  GLuint unit;
  GLuint texture;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> data;
  int kSize;
  string local_60;
  GLuint local_3c;
  char *pcStack_38;
  GLuint program;
  char *src_vs;
  Vector<float,_4> *expected_value_local;
  Vector<float,_4> *write_value_local;
  BasicAllFormatsStoreFS *pBStack_18;
  GLenum internalformat_local;
  BasicAllFormatsStoreFS *this_local;
  
  pcStack_38 = 
  "\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}";
  src_vs = (char *)expected_value;
  expected_value_local = write_value;
  write_value_local._4_4_ = internalformat;
  pBStack_18 = this;
  GenFS<tcu::Vector<float,4>>(&local_60,this,internalformat,write_value);
  src_fs = (char *)std::__cxx11::string::c_str();
  GVar3 = glcts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
                    ((ShaderImageLoadStoreBase *)this,
                     "\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                     ,src_fs,false,false);
  std::__cxx11::string::~string((string *)&local_60);
  data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0xb;
  local_3c = GVar3;
  std::allocator<tcu::Vector<float,_4>_>::allocator
            ((allocator<tcu::Vector<float,_4>_> *)((long)&unit + 3));
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&texture,0x79
             ,(allocator<tcu::Vector<float,_4>_> *)((long)&unit + 3));
  std::allocator<tcu::Vector<float,_4>_>::~allocator
            ((allocator<tcu::Vector<float,_4>_> *)((long)&unit + 3));
  glu::CallLogWrapper::glGenTextures((CallLogWrapper *)(this + 8),1,&c_program);
  glu::CallLogWrapper::glUseProgram((CallLogWrapper *)(this + 8),local_3c);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0xde1,c_program);
  glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)(this + 8),0xde1,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)(this + 8),0xde1,0x2800,0x2600);
  glu::CallLogWrapper::glTexStorage2D
            ((CallLogWrapper *)(this + 8),0xde1,1,write_value_local._4_4_,0xb,0xb);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0xde1,0);
  glu::CallLogWrapper::glViewport((CallLogWrapper *)(this + 8),0,0,0xb,0xb);
  glu::CallLogWrapper::glBindImageTexture
            ((CallLogWrapper *)(this + 8),2,c_program,0,'\0',0,0x88b9,write_value_local._4_4_);
  glu::CallLogWrapper::glBindVertexArray((CallLogWrapper *)(this + 8),*(GLuint *)(this + 0x28));
  glu::CallLogWrapper::glDrawArrays((CallLogWrapper *)(this + 8),5,0,4);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0xde1,c_program);
  glu::CallLogWrapper::glMemoryBarrier((CallLogWrapper *)(this + 8),0x100);
  GenC<tcu::Vector<float,4>>
            ((string *)
             &out_data.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,this,expected_value_local);
  GVar3 = glcts::anon_unknown_0::ShaderImageLoadStoreBase::CreateComputeProgram
                    ((ShaderImageLoadStoreBase *)this,
                     (string *)
                     &out_data.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,false);
  std::__cxx11::string::~string
            ((string *)
             &out_data.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::allocator<tcu::Vector<float,_4>_>::allocator
            ((allocator<tcu::Vector<float,_4>_> *)((long)&map_data + 7));
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&m_buffer,
             0x79,(allocator<tcu::Vector<float,_4>_> *)((long)&map_data + 7));
  std::allocator<tcu::Vector<float,_4>_>::~allocator
            ((allocator<tcu::Vector<float,_4>_> *)((long)&map_data + 7));
  glu::CallLogWrapper::glGenBuffers((CallLogWrapper *)(this + 8),1,(GLuint *)&map_data);
  glu::CallLogWrapper::glBindBufferBase((CallLogWrapper *)(this + 8),0x90d2,0,(GLuint)map_data);
  data_00 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                      ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                       &m_buffer,0);
  glu::CallLogWrapper::glBufferData((CallLogWrapper *)(this + 8),0x90d2,0x790,data_00,0x88e4);
  glu::CallLogWrapper::glUseProgram((CallLogWrapper *)(this + 8),GVar3);
  glu::CallLogWrapper::glDispatchCompute((CallLogWrapper *)(this + 8),1,1,1);
  glu::CallLogWrapper::glMemoryBarrier((CallLogWrapper *)(this + 8),0x200);
  pvStack_e0 = glu::CallLogWrapper::glMapBufferRange((CallLogWrapper *)(this + 8),0x90d2,0,0x790,1);
  local_e4 = 0;
  do {
    if (0x78 < (int)local_e4) {
      glu::CallLogWrapper::glDeleteTextures((CallLogWrapper *)(this + 8),1,&c_program);
      glu::CallLogWrapper::glUseProgram((CallLogWrapper *)(this + 8),0);
      glu::CallLogWrapper::glDeleteProgram((CallLogWrapper *)(this + 8),local_3c);
      glu::CallLogWrapper::glDeleteProgram((CallLogWrapper *)(this + 8),GVar3);
      glu::CallLogWrapper::glDeleteBuffers((CallLogWrapper *)(this + 8),1,(GLuint *)&map_data);
      this_local._7_1_ = 1;
LAB_01468b26:
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&m_buffer
                );
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&texture)
      ;
      return (bool)(this_local._7_1_ & 1);
    }
    bVar2 = glcts::anon_unknown_0::ShaderImageLoadStoreBase::Equal
                      ((ShaderImageLoadStoreBase *)this,
                       (vec4 *)((long)pvStack_e0 + (long)(int)local_e4 * 0x10),(vec4 *)src_vs,
                       write_value_local._4_4_);
    uVar1 = local_e4;
    if (!bVar2) {
      tcu::Vector<float,_4>::Vector
                (&local_118,(Vector<float,_4> *)((long)pvStack_e0 + (long)(int)local_e4 * 0x10));
      ShaderImageLoadStoreBase::ToString<tcu::Vector<float,4>>
                (&local_108,(ShaderImageLoadStoreBase *)this,&local_118);
      uVar4 = std::__cxx11::string::c_str();
      tcu::Vector<float,_4>::Vector(&local_148,(Vector<float,_4> *)src_vs);
      ShaderImageLoadStoreBase::ToString<tcu::Vector<float,4>>
                (&local_138,(ShaderImageLoadStoreBase *)this,&local_148);
      uVar5 = std::__cxx11::string::c_str();
      ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
                (&local_168,(ShaderImageLoadStoreBase *)this,write_value_local._4_4_);
      uVar6 = std::__cxx11::string::c_str();
      glcts::anon_unknown_0::Output
                ("[%d] Value is: %s. Value should be: %s. Format is: %s. Unit is: %d.\n",
                 (ulong)uVar1,uVar4,uVar5,uVar6,2);
      std::__cxx11::string::~string((string *)&local_168);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&local_108);
      glu::CallLogWrapper::glDeleteTextures((CallLogWrapper *)(this + 8),1,&c_program);
      glu::CallLogWrapper::glUseProgram((CallLogWrapper *)(this + 8),0);
      glu::CallLogWrapper::glDeleteProgram((CallLogWrapper *)(this + 8),local_3c);
      glu::CallLogWrapper::glDeleteProgram((CallLogWrapper *)(this + 8),GVar3);
      glu::CallLogWrapper::glDeleteBuffers((CallLogWrapper *)(this + 8),1,(GLuint *)&map_data);
      this_local._7_1_ = 0;
      goto LAB_01468b26;
    }
    local_e4 = local_e4 + 1;
  } while( true );
}

Assistant:

bool Write(GLenum internalformat, const T& write_value, const T& expected_value)
	{
		const char* src_vs =
			NL "layout(location = 0) in vec4 i_position;" NL "void main() {" NL "  gl_Position = i_position;" NL "}";
		GLuint		   program = BuildProgram(src_vs, GenFS(internalformat, write_value).c_str());
		const int	  kSize   = 11;
		std::vector<T> data(kSize * kSize);
		GLuint		   texture;
		glGenTextures(1, &texture);
		glUseProgram(program);

		GLuint unit = 2;
		glBindTexture(GL_TEXTURE_2D, texture);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexStorage2D(GL_TEXTURE_2D, 1, internalformat, kSize, kSize);
		glBindTexture(GL_TEXTURE_2D, 0);

		glViewport(0, 0, kSize, kSize);
		glBindImageTexture(unit, texture, 0, GL_FALSE, 0, GL_WRITE_ONLY, internalformat);
		glBindVertexArray(m_vao);
		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

		glBindTexture(GL_TEXTURE_2D, texture);
		glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);

		GLuint		   c_program = CreateComputeProgram(GenC(write_value));
		std::vector<T> out_data(kSize * kSize);
		GLuint		   m_buffer;
		glGenBuffers(1, &m_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, kSize * kSize * 4 * 4, &out_data[0], GL_STATIC_DRAW);

		glUseProgram(c_program);
		glDispatchCompute(1, 1, 1);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		T* map_data = (T*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, kSize * kSize * 4 * 4, GL_MAP_READ_BIT);
		for (int i = 0; i < kSize * kSize; ++i)
		{
			if (!Equal(map_data[i], expected_value, internalformat))
			{
				Output("[%d] Value is: %s. Value should be: %s. Format is: %s. Unit is: %d.\n", i,
					   ToString(map_data[i]).c_str(), ToString(expected_value).c_str(),
					   FormatEnumToString(internalformat).c_str(), unit);
				glDeleteTextures(1, &texture);
				glUseProgram(0);
				glDeleteProgram(program);
				glDeleteProgram(c_program);
				glDeleteBuffers(1, &m_buffer);
				return false;
			}
		}
		glDeleteTextures(1, &texture);
		glUseProgram(0);
		glDeleteProgram(program);
		glDeleteProgram(c_program);
		glDeleteBuffers(1, &m_buffer);
		return true;
	}